

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual.cpp
# Opt level: O0

SIZE_T VirtualQuery(LPCVOID lpAddress,PMEMORY_BASIC_INFORMATION lpBuffer,SIZE_T dwLength)

{
  BYTE VirtualProtect;
  BOOL BVar1;
  INT IVar2;
  INT IVar3;
  CPalThread *pThread;
  LPVOID lpAddress_00;
  PCMI pInformation;
  DWORD DVar4;
  bool bVar5;
  DWORD local_58;
  SIZE_T local_50;
  SIZE_T RegionSize;
  INT AllocationType;
  BYTE AccessProtection;
  SIZE_T Index;
  CPalThread *pthrCurrent;
  UINT_PTR StartBoundary;
  PCMI pEntry;
  SIZE_T dwLength_local;
  PMEMORY_BASIC_INFORMATION lpBuffer_local;
  LPCVOID lpAddress_local;
  
  if (!PAL_InitializeChakraCoreCalled) {
    abort();
  }
  pThread = CorUnix::InternalGetCurrentThread();
  CorUnix::InternalEnterCriticalSection(pThread,&virtual_critsec);
  if (lpBuffer == (PMEMORY_BASIC_INFORMATION)0x0) {
    if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
      abort();
    }
    CorUnix::CPalThread::SetLastError(0x3e6);
  }
  else if (dwLength < 0x30) {
    if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
      abort();
    }
    CorUnix::CPalThread::SetLastError(0x18);
  }
  else {
    lpAddress_00 = (LPVOID)((ulong)lpAddress & 0xfffffffffffff000);
    pInformation = VIRTUALFindRegionInformation((UINT_PTR)lpAddress_00);
    if (pInformation == (PCMI)0x0) {
      BVar1 = MAPGetRegionInfo(lpAddress_00,lpBuffer);
      if (BVar1 == 0) {
        lpBuffer->BaseAddress = lpAddress_00;
        lpBuffer->RegionSize = 0;
        lpBuffer->State = 0x10000;
      }
    }
    else {
      _AllocationType = (long)lpAddress_00 - pInformation->startBoundary >> 0xc;
      VirtualProtect = pInformation->pProtectionState[_AllocationType];
      IVar2 = VIRTUALGetAllocationType(_AllocationType,pInformation);
      local_50 = 0;
      if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
        abort();
      }
      while( true ) {
        bVar5 = false;
        if (_AllocationType < pInformation->memSize >> 0xc) {
          IVar3 = VIRTUALGetAllocationType(_AllocationType,pInformation);
          bVar5 = false;
          if (IVar3 == IVar2) {
            bVar5 = pInformation->pProtectionState[_AllocationType] == VirtualProtect;
          }
        }
        if (!bVar5) break;
        local_50 = local_50 + 0x1000;
        _AllocationType = _AllocationType + 1;
      }
      if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
        abort();
      }
      lpBuffer->AllocationProtect = pInformation->accessProtection;
      lpBuffer->BaseAddress = lpAddress_00;
      if (IVar2 == 0x1000) {
        local_58 = VIRTUALConvertVirtualFlags(VirtualProtect);
      }
      else {
        local_58 = 0;
      }
      lpBuffer->Protect = local_58;
      lpBuffer->RegionSize = local_50;
      DVar4 = 0x2000;
      if (IVar2 == 0x1000) {
        DVar4 = 0x1000;
      }
      lpBuffer->State = DVar4;
      if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
        abort();
      }
    }
  }
  CorUnix::InternalLeaveCriticalSection(pThread,&virtual_critsec);
  if ((PAL_InitializeChakraCoreCalled & 1U) != 0) {
    return 0x30;
  }
  abort();
}

Assistant:

SIZE_T
PALAPI
VirtualQuery(
         IN LPCVOID lpAddress,
         OUT PMEMORY_BASIC_INFORMATION lpBuffer,
         IN SIZE_T dwLength)
{
    PCMI     pEntry = NULL;
    UINT_PTR StartBoundary = 0;
    CPalThread * pthrCurrent;

    PERF_ENTRY(VirtualQuery);
    ENTRY("VirtualQuery(lpAddress=%p, lpBuffer=%p, dwLength=%u)\n",
          lpAddress, lpBuffer, dwLength);

    pthrCurrent = InternalGetCurrentThread();
    InternalEnterCriticalSection(pthrCurrent, &virtual_critsec);

    if ( !lpBuffer)
    {
        ERROR( "lpBuffer has to be a valid pointer.\n" );
        pthrCurrent->SetLastError( ERROR_NOACCESS );
        goto ExitVirtualQuery;
    }
    if ( dwLength < sizeof( *lpBuffer ) )
    {
        ERROR( "dwLength cannot be smaller then the size of *lpBuffer.\n" );
        pthrCurrent->SetLastError( ERROR_BAD_LENGTH );
        goto ExitVirtualQuery;
    }

    StartBoundary = (UINT_PTR)lpAddress & ~VIRTUAL_PAGE_MASK;

#if MMAP_IGNORES_HINT
    // Make sure we have memory to map before we try to query it.
    VIRTUALGetBackingFile(pthrCurrent);

    // If we're suballocating, claim that any memory that isn't in our
    // suballocated block is already allocated. This keeps callers from
    // using these results to try to allocate those blocks and failing.
    if (StartBoundary < (UINT_PTR) gBackingBaseAddress ||
        StartBoundary >= (UINT_PTR) gBackingBaseAddress + BACKING_FILE_SIZE)
    {
        if (StartBoundary < (UINT_PTR) gBackingBaseAddress)
        {
            lpBuffer->RegionSize = (UINT_PTR) gBackingBaseAddress - StartBoundary;
        }
        else
        {
            lpBuffer->RegionSize = -StartBoundary;
        }
        lpBuffer->BaseAddress = (void *) StartBoundary;
        lpBuffer->State = MEM_COMMIT;
        lpBuffer->Type = MEM_MAPPED;
        lpBuffer->AllocationProtect = 0;
        lpBuffer->Protect = 0;
        goto ExitVirtualQuery;
    }
#endif  // MMAP_IGNORES_HINT

    /* Find the entry. */
    pEntry = VIRTUALFindRegionInformation( StartBoundary );

    if ( !pEntry )
    {
        /* Can't find a match, or no list present. */
        /* Next, looking for this region in file maps */
        if (!MAPGetRegionInfo((LPVOID)StartBoundary, lpBuffer))
        {
            // When all else fails, call vm_region() if it's available.

            // Initialize the State to be MEM_FREE, in which case AllocationBase, AllocationProtect,
            // Protect, and Type are all undefined.
            lpBuffer->BaseAddress = (LPVOID)StartBoundary;
            lpBuffer->RegionSize = 0;
            lpBuffer->State = MEM_FREE;
#if HAVE_VM_ALLOCATE
            VM_ALLOCATE_VirtualQuery(lpAddress, lpBuffer);
#endif
        }
    }
    else
    {
        /* Starting page. */
        SIZE_T Index = ( StartBoundary - pEntry->startBoundary ) / VIRTUAL_PAGE_SIZE;

        /* Attributes to check for. */
        BYTE AccessProtection = pEntry->pProtectionState[ Index ];
        INT AllocationType = VIRTUALGetAllocationType( Index, pEntry );
        SIZE_T RegionSize = 0;

        TRACE( "Index = %d, Number of Pages = %d. \n",
               Index, pEntry->memSize / VIRTUAL_PAGE_SIZE );

        while ( Index < pEntry->memSize / VIRTUAL_PAGE_SIZE &&
                VIRTUALGetAllocationType( Index, pEntry ) == AllocationType &&
                pEntry->pProtectionState[ Index ] == AccessProtection )
        {
            RegionSize += VIRTUAL_PAGE_SIZE;
            Index++;
        }

        TRACE( "RegionSize = %d.\n", RegionSize );

        /* Fill the structure.*/
        lpBuffer->AllocationProtect = pEntry->accessProtection;
        lpBuffer->BaseAddress = (LPVOID)StartBoundary;

        lpBuffer->Protect = AllocationType == MEM_COMMIT ?
            VIRTUALConvertVirtualFlags( AccessProtection ) : 0;

        lpBuffer->RegionSize = RegionSize;
        lpBuffer->State =
            ( AllocationType == MEM_COMMIT ? MEM_COMMIT : MEM_RESERVE );
        WARN( "Ignoring lpBuffer->Type. \n" );
    }

ExitVirtualQuery:

    InternalLeaveCriticalSection(pthrCurrent, &virtual_critsec);

    LOGEXIT( "VirtualQuery returning %d.\n", sizeof( *lpBuffer ) );
    PERF_EXIT(VirtualQuery);
    return sizeof( *lpBuffer );
}